

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O0

int Find(Vector *V,ElementType x)

{
  int local_20;
  int i;
  ElementType x_local;
  Vector *V_local;
  
  local_20 = 0;
  while( true ) {
    if (V->VectorLength <= local_20) {
      return -1;
    }
    if (V->elements[local_20] == x) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

int Find(Vector *V,ElementType x)  //在向量中查找
{
    int i;
    for(i = 0; i < V->VectorLength; i++)
        if(V->elements[i]==x)
            return i;  //找到返回结点序号
    return -1;  //未找到
}